

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_scene_device.cpp
# Opt level: O0

void device_render(int *pixels,uint width,uint height,float time,ISPCCamera *camera)

{
  int i;
  float in_stack_00000058;
  int in_stack_0000005c;
  undefined4 local_24;
  
  for (local_24 = 0; local_24 < embree::data; local_24 = local_24 + 1) {
    embree::animateSphere(in_stack_0000005c,in_stack_00000058);
  }
  rtcCommitScene(DAT_006043e8);
  _DAT_006043f0 = rtcGetSceneTraversable(DAT_006043e8);
  return;
}

Assistant:

void device_render (int* pixels,
                           const unsigned int width,
                           const unsigned int height,
                           const float time,
                           const ISPCCamera& camera)
{
  /* animate sphere */
  for (int i=0; i<data.numSpheres; i++)
    animateSphere(i,time+i);

  /* commit changes to scene */
#if defined(EMBREE_SYCL_TUTORIAL)
  rtcCommitSceneWithQueue (data.g_scene, *global_gpu_queue);
#else
  rtcCommitScene (data.g_scene);
#endif
  /* The RTCTraversable object may be invaludated and has to be acquired again after the dynamic scene has been commited */
  data.g_traversable = rtcGetSceneTraversable(data.g_scene);
}